

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QSize __thiscall
QStyleSheetStyle::defaultSize(QStyleSheetStyle *this,QWidget *w,QSize sz,QRect *rect,int pe)

{
  long lVar1;
  int iVar2;
  QStyle *pQVar3;
  QSize in_RDX;
  undefined8 in_RSI;
  QSize *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  int iconSize;
  int pm_2;
  int pm_1;
  int pm;
  QStyle *base;
  QRect *in_stack_ffffffffffffff98;
  QStyleSheetStyle *in_stack_ffffffffffffffa8;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = baseStyle(in_stack_ffffffffffffffa8);
  switch(in_R8D) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 9:
  case 0x12:
  case 0x13:
  case 0x28:
    iVar2 = QSize::width((QSize *)0x4289c7);
    if (iVar2 == -1) {
      QSize::setWidth(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    iVar2 = QSize::height((QSize *)0x4289e5);
    if (iVar2 == -1) {
      QSize::setHeight(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    break;
  case 5:
  case 0x25:
    iVar2 = QSize::width((QSize *)0x428869);
    if (iVar2 == -1) {
      (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x25,0,in_RSI);
      QSize::setWidth(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    iVar2 = QSize::height((QSize *)0x42889e);
    if (iVar2 == -1) {
      (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x26,0,in_RSI);
      QSize::setHeight(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    break;
  case 6:
  case 0x10:
    iVar2 = QSize::width((QSize *)0x4288d8);
    if (iVar2 == -1) {
      (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x27,0,in_RSI);
      QSize::setWidth(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    iVar2 = QSize::height((QSize *)0x42890d);
    if (iVar2 == -1) {
      (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x28,0,in_RSI);
      QSize::setHeight(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    break;
  case 7:
    (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,2,0,in_RSI);
    iVar2 = QSize::width((QSize *)0x428965);
    if (iVar2 == -1) {
      QSize::setWidth(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    iVar2 = QSize::height((QSize *)0x428982);
    if (iVar2 == -1) {
      QSize::setHeight(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    break;
  case 8:
    iVar2 = QSize::width((QSize *)0x4289a4);
    if (iVar2 == -1) {
      QSize::setWidth(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    break;
  default:
    break;
  case 0xb:
  case 0xd:
    iVar2 = QSize::width((QSize *)0x428a08);
    if (iVar2 == -1) {
      QSize::setWidth(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    iVar2 = QSize::height((QSize *)0x428a26);
    if (iVar2 == -1) {
      QRect::height(in_stack_ffffffffffffff98);
      QSize::setHeight(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    break;
  case 0x11:
    iVar2 = QSize::width((QSize *)0x428a58);
    if (iVar2 == -1) {
      (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,2,0,in_RSI);
      QSize::setWidth(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    break;
  case 0x15:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    (**(code **)((long)*in_RDI + 0xe0))(in_RDI,9,0,in_RSI);
    iVar2 = QSize::width((QSize *)0x428b0d);
    if (iVar2 == -1) {
      QSize::setWidth(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    iVar2 = QSize::height((QSize *)0x428b2a);
    if (iVar2 == -1) {
      QSize::setHeight(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    break;
  case 0x2b:
  case 0x2c:
    (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x2e,0,in_RSI);
    iVar2 = QSize::width((QSize *)0x428ab0);
    if (iVar2 == -1) {
      QSize::setWidth(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    iVar2 = QSize::height((QSize *)0x428acd);
    if (iVar2 == 1) {
      QSize::setHeight(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    break;
  case 0x3b:
  case 0x3c:
    (**(code **)((long)*in_RDI + 0xe0))(in_RDI,0x3e,0,in_RSI);
    QSize::QSize(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                 (int)in_stack_ffffffffffffff98);
    goto LAB_00428bc7;
  }
  iVar2 = QSize::height((QSize *)0x428b7d);
  if (iVar2 == -1) {
    QRect::height(in_stack_ffffffffffffff98);
    QSize::setHeight(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  iVar2 = QSize::width((QSize *)0x428ba2);
  local_10 = in_RDX;
  if (iVar2 == -1) {
    QRect::width(in_stack_ffffffffffffff98);
    QSize::setWidth(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
LAB_00428bc7:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QStyleSheetStyle::defaultSize(const QWidget *w, QSize sz, const QRect& rect, int pe) const
{
    QStyle *base = baseStyle();

    switch (pe) {
    case PseudoElement_Indicator:
    case PseudoElement_MenuCheckMark:
        if (sz.width() == -1)
            sz.setWidth(base->pixelMetric(PM_IndicatorWidth, nullptr, w));
        if (sz.height() == -1)
            sz.setHeight(base->pixelMetric(PM_IndicatorHeight, nullptr, w));
        break;

    case PseudoElement_ExclusiveIndicator:
    case PseudoElement_GroupBoxIndicator:
        if (sz.width() == -1)
            sz.setWidth(base->pixelMetric(PM_ExclusiveIndicatorWidth, nullptr, w));
        if (sz.height() == -1)
            sz.setHeight(base->pixelMetric(PM_ExclusiveIndicatorHeight, nullptr, w));
        break;

    case PseudoElement_PushButtonMenuIndicator: {
        int pm = base->pixelMetric(PM_MenuButtonIndicator, nullptr, w);
        if (sz.width() == -1)
            sz.setWidth(pm);
        if (sz.height() == -1)
            sz.setHeight(pm);
                                      }
        break;

    case PseudoElement_ComboBoxDropDown:
        if (sz.width() == -1)
            sz.setWidth(16);
        break;

    case PseudoElement_ComboBoxArrow:
    case PseudoElement_DownArrow:
    case PseudoElement_UpArrow:
    case PseudoElement_LeftArrow:
    case PseudoElement_RightArrow:
    case PseudoElement_ToolButtonMenuArrow:
    case PseudoElement_ToolButtonMenuIndicator:
    case PseudoElement_MenuRightArrow:
        if (sz.width() == -1)
            sz.setWidth(13);
        if (sz.height() == -1)
            sz.setHeight(13);
        break;

    case PseudoElement_SpinBoxUpButton:
    case PseudoElement_SpinBoxDownButton:
        if (sz.width() == -1)
            sz.setWidth(16);
        if (sz.height() == -1)
            sz.setHeight(rect.height()/2);
        break;

    case PseudoElement_ToolButtonMenu:
        if (sz.width() == -1)
            sz.setWidth(base->pixelMetric(PM_MenuButtonIndicator, nullptr, w));
        break;

    case PseudoElement_HeaderViewUpArrow:
    case PseudoElement_HeaderViewDownArrow: {
        int pm = base->pixelMetric(PM_HeaderMargin, nullptr, w);
        if (sz.width() == -1)
            sz.setWidth(pm);
        if (sz.height() == 1)
            sz.setHeight(pm);
        break;
                                            }

    case PseudoElement_ScrollBarFirst:
    case PseudoElement_ScrollBarLast:
    case PseudoElement_ScrollBarAddLine:
    case PseudoElement_ScrollBarSubLine:
    case PseudoElement_ScrollBarSlider: {
        int pm = pixelMetric(QStyle::PM_ScrollBarExtent, nullptr, w);
        if (sz.width() == -1)
            sz.setWidth(pm);
        if (sz.height() == -1)
            sz.setHeight(pm);
        break;
                                        }

    case PseudoElement_DockWidgetCloseButton:
    case PseudoElement_DockWidgetFloatButton: {
        int iconSize = pixelMetric(PM_SmallIconSize, nullptr, w);
        return QSize(iconSize, iconSize);
                                              }

    default:
        break;
    }

    // expand to rectangle
    if (sz.height() == -1)
        sz.setHeight(rect.height());
    if (sz.width() == -1)
        sz.setWidth(rect.width());

    return sz;
}